

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

ModportPortSymbol *
slang::ast::ModportPortSymbol::fromSyntax
          (ASTContext *context,ArgumentDirection direction,ModportNamedPortSyntax *syntax)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  string_view arg;
  string_view arg_00;
  bool bVar1;
  Compilation *context_00;
  Scope *expr_00;
  Symbol *pSVar2;
  Diagnostic *pDVar3;
  DeclaredType *this;
  SourceLocation SVar4;
  SyntaxNode *in_RDX;
  int in_ESI;
  size_t in_RDI;
  LookupLocation LVar5;
  Expression *expr;
  SourceLocation loc;
  ASTContext checkCtx;
  DeclaredType *sourceType;
  Scope *in_stack_00000118;
  bitmask<slang::ast::LookupFlags> in_stack_00000124;
  undefined1 in_stack_00000128 [16];
  undefined1 in_stack_00000138 [16];
  Diagnostic *diag_1;
  undefined1 in_stack_00000160 [16];
  Diagnostic *diag;
  bool in_stack_000001b6;
  bool in_stack_000001b7;
  HierarchicalReference *in_stack_000001b8;
  Symbol *in_stack_000001c0;
  ASTContext *in_stack_000001c8;
  SourceRange in_stack_000001d0;
  ModportPortSymbol *result;
  Token name;
  Compilation *comp;
  SourceLocation SVar6;
  ASTContext *in_stack_fffffffffffffdd0;
  SourceLocation in_stack_fffffffffffffdd8;
  bitmask<slang::ast::ASTFlags> in_stack_fffffffffffffde0;
  ASTContext *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  SourceLocation in_stack_fffffffffffffdf8;
  BumpAllocator *in_stack_fffffffffffffe00;
  DiagCode code;
  Diagnostic *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  Token *this_00;
  ArgumentDirection direction_00;
  bitmask<slang::ast::AssignFlags> in_stack_fffffffffffffe47;
  SourceRange local_1a0;
  Expression *local_190;
  SourceLocation local_188;
  bitmask<slang::ast::ASTFlags> local_180;
  bitmask<slang::ast::ASTFlags> local_178;
  underlying_type local_170;
  bitmask<slang::ast::ASTFlags> abStack_158 [5];
  DeclaredType *local_130;
  DeclaredType *local_128;
  SourceLocation local_120;
  undefined4 local_114;
  string_view local_110;
  SourceRange local_100;
  undefined4 local_ec;
  Diagnostic *local_e8;
  SourceLocation local_e0;
  undefined4 local_d4;
  string_view local_d0;
  SourceRange local_c0;
  undefined4 local_ac;
  Diagnostic *local_a8;
  bitmask<slang::ast::LookupFlags> local_9c;
  SourceRange local_98;
  Scope *local_88;
  uint32_t local_80;
  Scope *local_78;
  uint32_t local_70;
  string_view local_68;
  SourceLocation local_58;
  string_view local_50;
  ModportPortSymbol *local_40;
  Token local_38;
  Compilation *local_28;
  SyntaxNode *local_20;
  int local_14;
  size_t local_10;
  ModportPortSymbol *local_8;
  
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  context_00 = ASTContext::getCompilation((ASTContext *)0xff6abb);
  local_38._0_8_ = *(undefined8 *)(local_20 + 1);
  local_38.info = (Info *)local_20[1].parent;
  this_00 = &local_38;
  local_28 = context_00;
  local_50 = parsing::Token::valueText((Token *)in_stack_fffffffffffffde0.m_bits);
  local_58 = parsing::Token::location(this_00);
  direction_00 = (ArgumentDirection)((ulong)this_00 >> 0x20);
  local_40 = BumpAllocator::
             emplace<slang::ast::ModportPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::ArgumentDirection&>
                       (in_stack_fffffffffffffe00,
                        (basic_string_view<char,_std::char_traits<char>_> *)
                        in_stack_fffffffffffffdf8,
                        (SourceLocation *)
                        CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        (ArgumentDirection *)in_stack_fffffffffffffde8);
  code = SUB84((ulong)in_stack_fffffffffffffe00 >> 0x20,0);
  Symbol::setSyntax((Symbol *)local_40,local_20);
  expr_00 = not_null<const_slang::ast::Scope_*>::operator*
                      ((not_null<const_slang::ast::Scope_*> *)0xff6b64);
  local_68 = parsing::Token::valueText((Token *)in_stack_fffffffffffffde0.m_bits);
  LVar5 = ASTContext::getLocation(in_stack_fffffffffffffdd0);
  local_88 = LVar5.scope;
  local_80 = LVar5.index;
  local_78 = local_88;
  local_70 = local_80;
  local_98 = parsing::Token::range
                       ((Token *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  bitmask<slang::ast::LookupFlags>::bitmask(&local_9c,NoParentScope);
  SVar6 = local_98.startLoc;
  SVar4 = local_98.endLoc;
  pSVar2 = Lookup::unqualifiedAt
                     (in_stack_00000118,(string_view)in_stack_00000138,
                      (LookupLocation)in_stack_00000128,(SourceRange)in_stack_00000160,
                      in_stack_00000124);
  local_40->internalSymbol = pSVar2;
  if (local_40->internalSymbol != (Symbol *)0x0) {
    if (local_40->internalSymbol->kind == Subroutine) {
      local_ac = 0x360006;
      local_c0 = parsing::Token::range
                           ((Token *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      sourceRange.startLoc._4_4_ = in_stack_fffffffffffffdf4;
      sourceRange.startLoc._0_4_ = in_stack_fffffffffffffdf0;
      sourceRange.endLoc = in_stack_fffffffffffffdf8;
      pDVar3 = ASTContext::addDiag(in_stack_fffffffffffffde8,code,sourceRange);
      local_a8 = pDVar3;
      local_d0 = parsing::Token::valueText((Token *)in_stack_fffffffffffffde0.m_bits);
      arg._M_str = (char *)pDVar3;
      arg._M_len = local_10;
      Diagnostic::operator<<(in_stack_fffffffffffffe10,arg);
      local_d4 = 0x50001;
      local_e0 = local_40->internalSymbol->location;
      Diagnostic::addNote((Diagnostic *)SVar4,SUB84(in_stack_fffffffffffffde0.m_bits >> 0x20,0),
                          in_stack_fffffffffffffdd8);
      local_40->internalSymbol = (Symbol *)0x0;
    }
    else {
      bVar1 = SemanticFacts::isAllowedInModport(local_40->internalSymbol->kind);
      if (!bVar1) {
        local_ec = 0x8f0006;
        local_100 = parsing::Token::range
                              ((Token *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0
                                                ));
        sourceRange_00.startLoc._4_4_ = in_stack_fffffffffffffdf4;
        sourceRange_00.startLoc._0_4_ = in_stack_fffffffffffffdf0;
        sourceRange_00.endLoc = in_stack_fffffffffffffdf8;
        pDVar3 = ASTContext::addDiag(in_stack_fffffffffffffde8,code,sourceRange_00);
        local_e8 = pDVar3;
        local_110 = parsing::Token::valueText((Token *)in_stack_fffffffffffffde0.m_bits);
        arg_00._M_str = in_stack_fffffffffffffe20;
        arg_00._M_len = in_stack_fffffffffffffe18;
        Diagnostic::operator<<(pDVar3,arg_00);
        local_114 = 0x50001;
        local_120 = local_40->internalSymbol->location;
        Diagnostic::addNote((Diagnostic *)SVar4,SUB84(in_stack_fffffffffffffde0.m_bits >> 0x20,0),
                            in_stack_fffffffffffffdd8);
        local_40->internalSymbol = (Symbol *)0x0;
      }
    }
  }
  if (local_40->internalSymbol == (Symbol *)0x0) {
    Compilation::getErrorType(local_28);
    ValueSymbol::setType((ValueSymbol *)SVar4,(Type *)SVar6);
    local_8 = local_40;
  }
  else {
    local_128 = Symbol::getDeclaredType((Symbol *)in_stack_fffffffffffffdd8);
    local_130 = (DeclaredType *)ValueSymbol::getDeclaredType((ValueSymbol *)SVar6);
    this = not_null<slang::ast::DeclaredType_*>::operator->
                     ((not_null<slang::ast::DeclaredType_*> *)0xff6f21);
    DeclaredType::setLink(this,local_128);
    local_170 = (underlying_type)ast::operator|((ASTFlags)in_stack_fffffffffffffdd8,(ASTFlags)SVar4)
    ;
    ASTContext::resetFlags((ASTContext *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffde0);
    if (local_14 != 0) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_178,LValue);
      bitmask<slang::ast::ASTFlags>::operator|=(abStack_158,&local_178);
      if (local_14 == 2) {
        bitmask<slang::ast::ASTFlags>::bitmask(&local_180,LAndRValue);
        bitmask<slang::ast::ASTFlags>::operator|=(abStack_158,&local_180);
      }
    }
    SVar6 = (local_40->super_ValueSymbol).super_Symbol.location;
    local_188 = SVar6;
    std::basic_string_view<char,_std::char_traits<char>_>::length
              (&(local_40->super_ValueSymbol).super_Symbol.name);
    SVar4 = SourceLocation::operator+<unsigned_long>
                      ((SourceLocation *)in_stack_fffffffffffffdd8,(unsigned_long)SVar4);
    SourceRange::SourceRange(&local_1a0,SVar6,SVar4);
    local_190 = ValueExpressionBase::fromSymbol
                          (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001d0,
                           in_stack_000001b7,in_stack_000001b6);
    SVar6 = local_188;
    memset(&stack0xfffffffffffffe47,0,1);
    bitmask<slang::ast::AssignFlags>::bitmask
              ((bitmask<slang::ast::AssignFlags> *)&stack0xfffffffffffffe47);
    Expression::checkConnectionDirection
              ((Expression *)expr_00,direction_00,(ASTContext *)context_00,SVar6,
               in_stack_fffffffffffffe47);
    local_40->connExpr = local_190;
    local_8 = local_40;
  }
  return local_8;
}

Assistant:

ModportPortSymbol& ModportPortSymbol::fromSyntax(const ASTContext& context,
                                                 ArgumentDirection direction,
                                                 const ModportNamedPortSyntax& syntax) {
    auto& comp = context.getCompilation();
    auto name = syntax.name;
    auto result = comp.emplace<ModportPortSymbol>(name.valueText(), name.location(), direction);
    result->setSyntax(syntax);
    result->internalSymbol = Lookup::unqualifiedAt(*context.scope, name.valueText(),
                                                   context.getLocation(), name.range(),
                                                   LookupFlags::NoParentScope);

    if (result->internalSymbol) {
        if (result->internalSymbol->kind == SymbolKind::Subroutine) {
            auto& diag = context.addDiag(diag::ExpectedImportExport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
        else if (!SemanticFacts::isAllowedInModport(result->internalSymbol->kind)) {
            auto& diag = context.addDiag(diag::NotAllowedInModport, name.range());
            diag << name.valueText();
            diag.addNote(diag::NoteDeclarationHere, result->internalSymbol->location);
            result->internalSymbol = nullptr;
        }
    }

    if (!result->internalSymbol) {
        result->setType(comp.getErrorType());
        return *result;
    }

    auto sourceType = result->internalSymbol->getDeclaredType();
    SLANG_ASSERT(sourceType);
    result->getDeclaredType()->setLink(*sourceType);

    // Perform checking on the connected symbol to make sure it's allowed
    // given the modport's direction.
    ASTContext checkCtx = context.resetFlags(ASTFlags::NonProcedural | ASTFlags::NotADriver);
    if (direction != ArgumentDirection::In) {
        checkCtx.flags |= ASTFlags::LValue;
        if (direction == ArgumentDirection::InOut)
            checkCtx.flags |= ASTFlags::LAndRValue;
    }

    auto loc = result->location;
    auto& expr = ValueExpressionBase::fromSymbol(checkCtx, *result->internalSymbol, nullptr,
                                                 {loc, loc + result->name.length()});

    Expression::checkConnectionDirection(expr, direction, checkCtx, loc);

    result->connExpr = &expr;
    return *result;
}